

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFRestore<(moira::Instr)197,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  undefined1 local_3c [20];
  
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  Op<(moira::Mode)8,2>((Ea<(moira::Mode)8,_2> *)local_3c,this,op & 7,addr);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)8,_2> *)local_3c);
  return;
}

Assistant:

void
Moira::dasmFRestore(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}